

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

int Rtm_ManLatchMax(Rtm_Man_t *p)

{
  int iVar1;
  Rtm_Obj_t *pObj_00;
  Rtm_Edg_t *pRVar2;
  int local_2c;
  int local_28;
  int k;
  int i;
  int nLatchMax;
  Rtm_Edg_t *pEdge;
  Rtm_Obj_t *pObj;
  Rtm_Man_t *p_local;
  
  k = 0;
  for (local_28 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_28 < iVar1; local_28 = local_28 + 1) {
    pObj_00 = (Rtm_Obj_t *)Vec_PtrEntry(p->vObjs,local_28);
    for (local_2c = 0; local_2c < (int)(*(uint *)&pObj_00->field_0x8 >> 7 & 0xff);
        local_2c = local_2c + 1) {
      pRVar2 = Rtm_ObjEdge(pObj_00,local_2c);
      k = Abc_MaxInt(k,*(uint *)pRVar2 & 0xfff);
    }
  }
  return k;
}

Assistant:

int Rtm_ManLatchMax( Rtm_Man_t * p )
{
    Rtm_Obj_t * pObj;
    Rtm_Edg_t * pEdge;
    int nLatchMax = 0, i, k;//, c, Val;
    Rtm_ManForEachObj( p, pObj, i )
    Rtm_ObjForEachFaninEdge( pObj, pEdge, k )
    {
/*
        for ( c = 0; c < (int)pEdge->nLats; c++ )
        {
            Val = Rtm_ObjGetOne( p, pEdge, c );
            assert( Val == 1 || Val == 2 );
        }
*/
        nLatchMax = Abc_MaxInt( nLatchMax, (int)pEdge->nLats );
    }
    return nLatchMax;
}